

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O3

string * __thiscall
absl::lts_20250127::StatusCodeToString_abi_cxx11_
          (string *__return_storage_ptr__,lts_20250127 *this,StatusCode code)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "OK";
    pcVar1 = "";
    break;
  case 1:
    pcVar2 = "CANCELLED";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "UNKNOWN";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "INVALID_ARGUMENT";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "DEADLINE_EXCEEDED";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "NOT_FOUND";
    pcVar1 = "";
    break;
  case 6:
    pcVar2 = "ALREADY_EXISTS";
    pcVar1 = "";
    break;
  case 7:
    pcVar2 = "PERMISSION_DENIED";
    pcVar1 = "";
    break;
  case 8:
    pcVar2 = "RESOURCE_EXHAUSTED";
    pcVar1 = "";
    break;
  case 9:
    pcVar2 = "FAILED_PRECONDITION";
    pcVar1 = "";
    break;
  case 10:
    pcVar2 = "ABORTED";
    pcVar1 = "";
    break;
  case 0xb:
    pcVar2 = "OUT_OF_RANGE";
    pcVar1 = "";
    break;
  case 0xc:
    pcVar2 = "UNIMPLEMENTED";
    pcVar1 = "";
    break;
  case 0xd:
    pcVar2 = "INTERNAL";
    pcVar1 = "";
    break;
  case 0xe:
    pcVar2 = "UNAVAILABLE";
    pcVar1 = "";
    break;
  case 0xf:
    pcVar2 = "DATA_LOSS";
    pcVar1 = "";
    break;
  case 0x10:
    pcVar2 = "UNAUTHENTICATED";
    pcVar1 = "";
    break;
  default:
    pcVar1 = "";
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string StatusCodeToString(StatusCode code) {
  switch (code) {
    case StatusCode::kOk:
      return "OK";
    case StatusCode::kCancelled:
      return "CANCELLED";
    case StatusCode::kUnknown:
      return "UNKNOWN";
    case StatusCode::kInvalidArgument:
      return "INVALID_ARGUMENT";
    case StatusCode::kDeadlineExceeded:
      return "DEADLINE_EXCEEDED";
    case StatusCode::kNotFound:
      return "NOT_FOUND";
    case StatusCode::kAlreadyExists:
      return "ALREADY_EXISTS";
    case StatusCode::kPermissionDenied:
      return "PERMISSION_DENIED";
    case StatusCode::kUnauthenticated:
      return "UNAUTHENTICATED";
    case StatusCode::kResourceExhausted:
      return "RESOURCE_EXHAUSTED";
    case StatusCode::kFailedPrecondition:
      return "FAILED_PRECONDITION";
    case StatusCode::kAborted:
      return "ABORTED";
    case StatusCode::kOutOfRange:
      return "OUT_OF_RANGE";
    case StatusCode::kUnimplemented:
      return "UNIMPLEMENTED";
    case StatusCode::kInternal:
      return "INTERNAL";
    case StatusCode::kUnavailable:
      return "UNAVAILABLE";
    case StatusCode::kDataLoss:
      return "DATA_LOSS";
    default:
      return "";
  }
}